

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

double xmlXPathCastToNumberInternal(xmlXPathParserContextPtr ctxt,xmlXPathObjectPtr val)

{
  xmlChar *str;
  double dVar1;
  
  if (val == (xmlXPathObjectPtr)0x0) goto switchD_001bcc37_caseD_0;
  dVar1 = 0.0;
  switch(val->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    str = xmlXPathCastNodeSetToString(val->nodesetval);
    if (str != (xmlChar *)0x0) {
      dVar1 = xmlXPathStringEvalNumber(str);
      (*xmlFree)(str);
      return dVar1;
    }
    xmlXPathPErrMemory(ctxt);
  case XPATH_UNDEFINED:
  case XPATH_USERS:
switchD_001bcc37_caseD_0:
    dVar1 = xmlXPathNAN;
    break;
  case XPATH_BOOLEAN:
    if (val->boolval != 0) {
      dVar1 = 1.0;
    }
    break;
  case XPATH_NUMBER:
    dVar1 = val->floatval;
    break;
  case XPATH_STRING:
    dVar1 = xmlXPathStringEvalNumber(val->stringval);
    return dVar1;
  }
  return dVar1;
}

Assistant:

static double
xmlXPathCastToNumberInternal(xmlXPathParserContextPtr ctxt,
                             xmlXPathObjectPtr val) {
    double ret = 0.0;

    if (val == NULL)
	return(xmlXPathNAN);
    switch (val->type) {
    case XPATH_UNDEFINED:
	ret = xmlXPathNAN;
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE: {
        xmlChar *str;

	str = xmlXPathCastNodeSetToString(val->nodesetval);
        if (str == NULL) {
            xmlXPathPErrMemory(ctxt);
            ret = xmlXPathNAN;
        } else {
	    ret = xmlXPathCastStringToNumber(str);
            xmlFree(str);
        }
	break;
    }
    case XPATH_STRING:
	ret = xmlXPathCastStringToNumber(val->stringval);
	break;
    case XPATH_NUMBER:
	ret = val->floatval;
	break;
    case XPATH_BOOLEAN:
	ret = xmlXPathCastBooleanToNumber(val->boolval);
	break;
    case XPATH_USERS:
	/* TODO */
	ret = xmlXPathNAN;
	break;
    }
    return(ret);
}